

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplexmain.cpp
# Opt level: O1

void checkSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *soplex)

{
  double dVar1;
  Verbosity VVar2;
  ostream **ppoVar3;
  fpclass_type *pfVar4;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  fpclass_type *pfVar8;
  long lVar9;
  Verbosity old_verbosity;
  Verbosity VVar10;
  data_type *pdVar11;
  data_type *pdVar12;
  char *pcVar13;
  data_type *pdVar14;
  ostream *poVar15;
  byte bVar16;
  longdouble lVar17;
  Rational sumviol;
  Rational rowviol;
  Rational maxviol;
  Rational boundviol;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxviol_2;
  true_ local_339;
  data_type local_338;
  undefined8 local_328;
  undefined8 uStack_320;
  ulong local_318;
  void *pvStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined5 uStack_2d0;
  undefined3 uStack_2cb;
  undefined5 uStack_2c8;
  fpclass_type local_2c0 [2];
  data_type local_2b8;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  ulong local_298;
  void *pvStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined5 uStack_250;
  undefined3 uStack_24b;
  undefined5 uStack_248;
  fpclass_type local_240 [2];
  double local_238;
  double local_230;
  data_type local_228;
  undefined8 local_218;
  undefined8 uStack_210;
  ulong local_208;
  void *pvStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined5 uStack_1c0;
  undefined3 uStack_1bb;
  undefined5 uStack_1b8;
  undefined8 local_1b0;
  data_type local_1a8;
  undefined8 local_198;
  undefined8 uStack_190;
  ulong local_188;
  void *pvStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined5 uStack_140;
  undefined3 uStack_13b;
  uint uStack_138;
  undefined1 uStack_134;
  undefined8 local_130;
  data_type local_128;
  char local_113;
  char local_112;
  uint local_108;
  void *local_100;
  char local_f3;
  char local_f2;
  uint local_b8;
  undefined1 local_b4;
  fpclass_type local_b0;
  fpclass_type fStack_ac;
  data_type local_a8;
  char local_93;
  char local_92;
  uint local_88;
  void *local_80;
  char local_73;
  char local_72;
  uint local_38;
  undefined1 local_34;
  undefined8 local_30;
  
  bVar16 = 0;
  iVar6 = soplex->_currentSettings->_intParamValues[0x12];
  if ((iVar6 == 2) || ((iVar6 == 1 && (soplex->_currentSettings->_intParamValues[0x10] == 1)))) {
    if ((soplex->_hasSolReal == false) && ((soplex->_hasSolRational & 1U) == 0)) {
      VVar10 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar10) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"No primal solution available.\n",0x1e);
        (soplex->spxout).m_verbosity = VVar10;
      }
    }
    else {
      local_1a8.la[0] = 0;
      local_198 = CONCAT17(local_198._7_1_,0x10000000001);
      local_188 = 1;
      local_178 = CONCAT17(local_178._7_1_,0x10000000001);
      local_2b8.la[0] = 0;
      local_2a8 = CONCAT17(local_2a8._7_1_,0x10000000001);
      local_298 = 1;
      local_288 = CONCAT17(local_288._7_1_,0x10000000001);
      local_338.la[0] = 0;
      local_328 = CONCAT17(local_328._7_1_,0x10000000001);
      local_318 = 1;
      local_308 = CONCAT17(local_308._7_1_,0x10000000001);
      bVar5 = ::soplex::
              SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::getBoundViolationRational
                        (soplex,(Rational *)&local_1a8.ld,(Rational *)&local_338.ld);
      if (bVar5) {
        bVar5 = ::soplex::
                SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::getRowViolationRational
                          (soplex,(Rational *)&local_2b8.ld,(Rational *)&local_338.ld);
        if (!bVar5) goto LAB_004c43fa;
        VVar10 = (soplex->spxout).m_verbosity;
        if (2 < (int)VVar10) {
          (soplex->spxout).m_verbosity = INFO1;
          iVar6 = boost::multiprecision::backends::
                  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)&local_1a8.ld,
                            (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)&local_2b8.ld);
          pdVar12 = &local_2b8;
          if (0 < iVar6) {
            pdVar12 = &local_1a8;
          }
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_228.ld,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&pdVar12->ld);
          dVar1 = soplex->_currentSettings->_realParamValues[0];
          if (NAN(dVar1)) {
            pcVar13 = "infeasible";
          }
          else {
            lVar17 = (longdouble)dVar1;
            local_128.ld.capacity = SUB104(lVar17,0);
            local_128.la[0]._4_4_ = (undefined4)((unkuint10)lVar17 >> 0x20);
            local_128.la[1]._0_2_ = (undefined2)((unkuint10)lVar17 >> 0x40);
            local_230 = dVar1;
            bVar5 = boost::multiprecision::default_ops::
                    eval_gt_imp<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,long_double>
                              ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)&local_228.ld,(longdouble *)&local_128,(true_ *)&local_a8.ld);
            pcVar13 = "feasible";
            if (bVar5) {
              pcVar13 = "infeasible";
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"Primal solution ",
                     0x10);
          poVar15 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
          sVar7 = strlen(pcVar13);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,pcVar13,sVar7);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                     " in original problem (max. violation = ",0x27);
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_128.ld,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_228.ld);
          boost::multiprecision::operator<<
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                     (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)&local_128.ld);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],").\n",3);
          if ((local_f3 == '\0') && (local_f2 == '\0')) {
            operator_delete(local_100,(ulong)local_108 << 3);
          }
          if ((local_113 == '\0') && (local_112 == '\0')) {
            operator_delete((void *)CONCAT62(local_128.la[1]._2_6_,local_128.la[1]._0_2_),
                            (ulong)local_128.ld.capacity << 3);
          }
          (soplex->spxout).m_verbosity = VVar10;
          if ((local_1f8._5_1_ == '\0') && (local_1f8._6_1_ == '\0')) {
            operator_delete(pvStack_200,(local_208 & 0xffffffff) << 3);
          }
          if ((local_218._5_1_ == '\0') && (local_218._6_1_ == '\0')) {
            operator_delete(local_228.ld.data,(local_228.la[0] & 0xffffffff) << 3);
          }
        }
      }
      else {
LAB_004c43fa:
        VVar10 = (soplex->spxout).m_verbosity;
        if (2 < (int)VVar10) {
          (soplex->spxout).m_verbosity = INFO1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[3],"Could not check primal solution.\n",0x21);
          (soplex->spxout).m_verbosity = VVar10;
        }
      }
      if ((local_308._5_1_ == '\0') && (local_308._6_1_ == '\0')) {
        operator_delete(pvStack_310,(local_318 & 0xffffffff) << 3);
      }
      if ((local_328._5_1_ == '\0') && (local_328._6_1_ == '\0')) {
        operator_delete(local_338.ld.data,(local_338.la[0] & 0xffffffff) << 3);
      }
      if ((local_288._5_1_ == '\0') && (local_288._6_1_ == '\0')) {
        operator_delete(pvStack_290,(local_298 & 0xffffffff) << 3);
      }
      if ((local_2a8._5_1_ == '\0') && (local_2a8._6_1_ == '\0')) {
        operator_delete(local_2b8.ld.data,(local_2b8.la[0] & 0xffffffff) << 3);
      }
      if ((local_178._5_1_ == '\0') && (local_178._6_1_ == '\0')) {
        operator_delete(pvStack_180,(local_188 & 0xffffffff) << 3);
      }
      if ((local_198._5_1_ == '\0') && (local_198._6_1_ == '\0')) {
        operator_delete(local_1a8.ld.data,(local_1a8.la[0] & 0xffffffff) << 3);
      }
    }
    if ((soplex->_hasSolReal != false) || ((soplex->_hasSolRational & 1U) != 0)) {
      local_1a8.la[0] = 0;
      local_198 = CONCAT17(local_198._7_1_,0x10000000001);
      local_188 = 1;
      local_178 = CONCAT17(local_178._7_1_,0x10000000001);
      local_2b8.la[0] = 0;
      local_2a8 = CONCAT17(local_2a8._7_1_,0x10000000001);
      local_298 = 1;
      local_288 = CONCAT17(local_288._7_1_,0x10000000001);
      local_338.la[0] = 0;
      local_328 = CONCAT17(local_328._7_1_,0x10000000001);
      local_318 = 1;
      local_308 = CONCAT17(local_308._7_1_,0x10000000001);
      bVar5 = ::soplex::
              SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::getRedCostViolationRational
                        (soplex,(Rational *)&local_1a8.ld,(Rational *)&local_338.ld);
      if (bVar5) {
        bVar5 = ::soplex::
                SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::getDualViolationRational
                          (soplex,(Rational *)&local_2b8.ld,(Rational *)&local_338.ld);
        if (!bVar5) goto LAB_004c480e;
        VVar10 = (soplex->spxout).m_verbosity;
        if (2 < (int)VVar10) {
          (soplex->spxout).m_verbosity = INFO1;
          iVar6 = boost::multiprecision::backends::
                  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)&local_1a8.ld,
                            (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)&local_2b8.ld);
          pdVar12 = &local_2b8;
          if (0 < iVar6) {
            pdVar12 = &local_1a8;
          }
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_228.ld,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&pdVar12->ld);
          dVar1 = soplex->_currentSettings->_realParamValues[1];
          if (NAN(dVar1)) {
            pcVar13 = "infeasible";
          }
          else {
            lVar17 = (longdouble)dVar1;
            local_a8.ld.capacity = SUB104(lVar17,0);
            local_a8.la[0]._4_4_ = (undefined4)((unkuint10)lVar17 >> 0x20);
            local_a8.la[1]._0_2_ = (undefined2)((unkuint10)lVar17 >> 0x40);
            local_238 = dVar1;
            bVar5 = boost::multiprecision::default_ops::
                    eval_gt_imp<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,long_double>
                              ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)&local_228.ld,(longdouble *)&local_a8,&local_339);
            pcVar13 = "feasible";
            if (bVar5) {
              pcVar13 = "infeasible";
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"Dual solution ",0xe);
          poVar15 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
          sVar7 = strlen(pcVar13);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,pcVar13,sVar7);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                     " in original problem (max. violation = ",0x27);
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_a8.ld,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_228.ld);
          boost::multiprecision::operator<<
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                     (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)&local_a8.ld);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],").\n",3);
          if ((local_73 == '\0') && (local_72 == '\0')) {
            operator_delete(local_80,(ulong)local_88 << 3);
          }
          if ((local_93 == '\0') && (local_92 == '\0')) {
            operator_delete((void *)CONCAT62(local_a8.la[1]._2_6_,local_a8.la[1]._0_2_),
                            (ulong)local_a8.ld.capacity << 3);
          }
          (soplex->spxout).m_verbosity = VVar10;
          if ((local_1f8._5_1_ == '\0') && (local_1f8._6_1_ == '\0')) {
            operator_delete(pvStack_200,(local_208 & 0xffffffff) << 3);
          }
          if ((local_218._5_1_ == '\0') && (local_218._6_1_ == '\0')) {
            operator_delete(local_228.ld.data,(local_228.la[0] & 0xffffffff) << 3);
          }
        }
      }
      else {
LAB_004c480e:
        VVar10 = (soplex->spxout).m_verbosity;
        if (2 < (int)VVar10) {
          (soplex->spxout).m_verbosity = INFO1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[3],"Could not check dual solution.\n",0x1f);
          (soplex->spxout).m_verbosity = VVar10;
        }
      }
      if ((local_308._5_1_ == '\0') && (local_308._6_1_ == '\0')) {
        operator_delete(pvStack_310,(local_318 & 0xffffffff) << 3);
      }
      if ((local_328._5_1_ == '\0') && (local_328._6_1_ == '\0')) {
        operator_delete(local_338.ld.data,(local_338.la[0] & 0xffffffff) << 3);
      }
      if ((local_288._5_1_ == '\0') && (local_288._6_1_ == '\0')) {
        operator_delete(pvStack_290,(local_298 & 0xffffffff) << 3);
      }
      if ((local_2a8._5_1_ == '\0') && (local_2a8._6_1_ == '\0')) {
        operator_delete(local_2b8.ld.data,(local_2b8.la[0] & 0xffffffff) << 3);
      }
      if ((local_178._5_1_ == '\0') && (local_178._6_1_ == '\0')) {
        operator_delete(pvStack_180,(local_188 & 0xffffffff) << 3);
      }
      if ((local_198._5_1_ == '\0') && (local_198._6_1_ == '\0')) {
        operator_delete(local_1a8.ld.data,(local_1a8.la[0] & 0xffffffff) << 3);
      }
      goto LAB_004c4929;
    }
LAB_004c4527:
    VVar10 = (soplex->spxout).m_verbosity;
    if ((int)VVar10 < 3) goto LAB_004c4929;
    (soplex->spxout).m_verbosity = INFO1;
    poVar15 = (soplex->spxout).m_streams[3];
    pcVar13 = "No dual solution available.\n";
    lVar9 = 0x1c;
  }
  else {
    if ((soplex->_hasSolReal == false) && ((soplex->_hasSolRational & 1U) == 0)) {
      VVar10 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar10) {
        (soplex->spxout).m_verbosity = INFO1;
        poVar15 = (soplex->spxout).m_streams[3];
        pcVar13 = "No primal solution available.\n";
        lVar9 = 0x1e;
LAB_004c40b9:
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,pcVar13,lVar9);
        (soplex->spxout).m_verbosity = VVar10;
      }
    }
    else {
      local_240[0] = cpp_dec_float_finite;
      local_240[1] = 0x1c;
      local_2b8.la[0] = 0;
      local_2b8.ld.data = (limb_pointer)0x0;
      local_2a8 = 0;
      uStack_2a0 = 0;
      local_298 = 0;
      pvStack_290 = (void *)0x0;
      local_288 = 0;
      uStack_280 = 0;
      local_278 = 0;
      uStack_270 = 0;
      local_268 = 0;
      uStack_260 = 0;
      local_258 = 0;
      uStack_250 = 0;
      uStack_24b = 0;
      uStack_248 = 0;
      local_2c0[0] = cpp_dec_float_finite;
      local_2c0[1] = 0x1c;
      local_338.la[0] = 0;
      local_338.ld.data = (limb_pointer)0x0;
      local_328 = 0;
      uStack_320 = 0;
      local_318 = 0;
      pvStack_310 = (void *)0x0;
      local_308 = 0;
      uStack_300 = 0;
      local_2f8 = 0;
      uStack_2f0 = 0;
      local_2e8 = 0;
      uStack_2e0 = 0;
      local_2d8 = 0;
      uStack_2d0 = 0;
      uStack_2cb = 0;
      uStack_2c8 = 0;
      local_1b0 = 0x1c00000000;
      local_228.la[0] = 0;
      local_228.ld.data = (limb_pointer)0x0;
      local_218 = 0;
      uStack_210 = 0;
      local_208 = 0;
      pvStack_200 = (void *)0x0;
      local_1f8 = 0;
      uStack_1f0 = 0;
      local_1e8 = 0;
      uStack_1e0 = 0;
      local_1d8 = 0;
      uStack_1d0 = 0;
      local_1c8 = 0;
      uStack_1c0 = 0;
      uStack_1bb = 0;
      uStack_1b8 = 0;
      bVar5 = ::soplex::
              SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::getBoundViolation(soplex,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&local_2b8.ld,
                                  (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_228.ld);
      if (bVar5) {
        bVar5 = ::soplex::
                SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::getRowViolation(soplex,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&local_338.ld,
                                  (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_228.ld);
        if (bVar5) {
          VVar10 = (soplex->spxout).m_verbosity;
          if (2 < (int)VVar10) {
            (soplex->spxout).m_verbosity = INFO1;
            bVar5 = false;
            if ((local_240[0] != cpp_dec_float_NaN) &&
               (bVar5 = false, local_2c0[0] != cpp_dec_float_NaN)) {
              iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                ((cpp_dec_float<200U,_int,_void> *)&local_2b8.ld,
                                 (cpp_dec_float<200U,_int,_void> *)&local_338.ld);
              bVar5 = 0 < iVar6;
            }
            pdVar12 = &local_338;
            if (bVar5) {
              pdVar12 = &local_2b8;
            }
            pdVar11 = pdVar12;
            pdVar14 = &local_128;
            for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
              (pdVar14->ld).capacity =
                   (((cpp_dec_float<200U,_int,_void> *)&(pdVar11->ld).capacity)->data)._M_elems[0];
              pdVar11 = (data_type *)((long)pdVar11 + ((ulong)bVar16 * -2 + 1) * 4);
              pdVar14 = (data_type *)((long)pdVar14 + ((ulong)bVar16 * -2 + 1) * 4);
            }
            local_b8 = pdVar12[7].ld.capacity;
            local_b4 = *(bool *)((long)pdVar12 + 0x74);
            pfVar8 = local_2c0;
            if (bVar5) {
              pfVar8 = local_240;
            }
            local_b0 = *pfVar8;
            pfVar4 = local_2c0;
            if (bVar5) {
              pfVar4 = local_240;
            }
            fStack_ac = pfVar4[1];
            pcVar13 = "infeasible";
            if ((*pfVar8 != cpp_dec_float_NaN) &&
               (dVar1 = soplex->_currentSettings->_realParamValues[0], !NAN(dVar1))) {
              local_130 = 0x1c00000000;
              local_1a8.la[0] = 0;
              local_1a8.ld.data = (limb_pointer)0x0;
              local_198 = 0;
              uStack_190 = 0;
              local_188 = 0;
              pvStack_180 = (void *)0x0;
              local_178 = 0;
              uStack_170 = 0;
              local_168 = 0;
              uStack_160 = 0;
              local_158 = 0;
              uStack_150 = 0;
              local_148 = 0;
              uStack_140 = 0;
              uStack_13b = 0;
              uStack_138 = 0;
              uStack_134 = 0;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)&local_1a8.ld,dVar1);
              iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                ((cpp_dec_float<200U,_int,_void> *)&local_128.ld,
                                 (cpp_dec_float<200U,_int,_void> *)&local_1a8.ld);
              pcVar13 = "infeasible";
              if (iVar6 < 1) {
                pcVar13 = "feasible";
              }
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"Primal solution ",
                       0x10);
            poVar15 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
            sVar7 = strlen(pcVar13);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15,pcVar13,sVar7);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                       " in original problem (max. violation = ",0x27);
            VVar2 = (soplex->spxout).m_verbosity;
            ppoVar3 = (soplex->spxout).m_streams;
            poVar15 = ppoVar3[VVar2];
            *(uint *)(poVar15 + *(long *)(*(long *)poVar15 + -0x18) + 0x18) =
                 *(uint *)(poVar15 + *(long *)(*(long *)poVar15 + -0x18) + 0x18) & 0xfffffefb |
                 0x100;
            pdVar12 = &local_128;
            pdVar11 = &local_a8;
            for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
              (((cpp_dec_float<200U,_int,_void> *)&(pdVar11->ld).capacity)->data)._M_elems[0] =
                   (pdVar12->ld).capacity;
              pdVar12 = (data_type *)((long)pdVar12 + ((ulong)bVar16 * -2 + 1) * 4);
              pdVar11 = (data_type *)((long)pdVar11 + ((ulong)bVar16 * -2 + 1) * 4);
            }
            local_38 = local_b8;
            local_34 = local_b4;
            local_30 = CONCAT44(fStack_ac,local_b0);
            boost::multiprecision::operator<<
                      (ppoVar3[VVar2],
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_a8.ld);
            poVar15 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
            lVar9 = *(long *)poVar15;
            *(undefined8 *)(poVar15 + *(long *)(lVar9 + -0x18) + 8) = 8;
            lVar9 = *(long *)(lVar9 + -0x18);
            *(uint *)(poVar15 + lVar9 + 0x18) = *(uint *)(poVar15 + lVar9 + 0x18) & 0xfffffefb | 4;
            pcVar13 = ").\n";
            lVar9 = 3;
            goto LAB_004c40b9;
          }
          goto LAB_004c40c1;
        }
      }
      VVar10 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar10) {
        (soplex->spxout).m_verbosity = INFO1;
        poVar15 = (soplex->spxout).m_streams[3];
        pcVar13 = "Could not check primal solution.\n";
        lVar9 = 0x21;
        goto LAB_004c40b9;
      }
    }
LAB_004c40c1:
    if ((soplex->_hasSolReal == false) && ((soplex->_hasSolRational & 1U) == 0)) goto LAB_004c4527;
    local_240[0] = cpp_dec_float_finite;
    local_240[1] = 0x1c;
    local_2b8.la[0] = 0;
    local_2b8.ld.data = (limb_pointer)0x0;
    local_2a8 = 0;
    uStack_2a0 = 0;
    local_298 = 0;
    pvStack_290 = (void *)0x0;
    local_288 = 0;
    uStack_280 = 0;
    local_278 = 0;
    uStack_270 = 0;
    local_268 = 0;
    uStack_260 = 0;
    local_258 = 0;
    uStack_250 = 0;
    uStack_24b = 0;
    uStack_248 = 0;
    local_2c0[0] = cpp_dec_float_finite;
    local_2c0[1] = 0x1c;
    local_338.la[0] = 0;
    local_338.ld.data = (limb_pointer)0x0;
    local_328 = 0;
    uStack_320 = 0;
    local_318 = 0;
    pvStack_310 = (void *)0x0;
    local_308 = 0;
    uStack_300 = 0;
    local_2f8 = 0;
    uStack_2f0 = 0;
    local_2e8 = 0;
    uStack_2e0 = 0;
    local_2d8 = 0;
    uStack_2d0 = 0;
    uStack_2cb = 0;
    uStack_2c8 = 0;
    local_1b0 = 0x1c00000000;
    local_228.la[0] = 0;
    local_228.ld.data = (limb_pointer)0x0;
    local_218 = 0;
    uStack_210 = 0;
    local_208 = 0;
    pvStack_200 = (void *)0x0;
    local_1f8 = 0;
    uStack_1f0 = 0;
    local_1e8 = 0;
    uStack_1e0 = 0;
    local_1d8 = 0;
    uStack_1d0 = 0;
    local_1c8 = 0;
    uStack_1c0 = 0;
    uStack_1bb = 0;
    uStack_1b8 = 0;
    bVar5 = ::soplex::
            SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::getRedCostViolation
                      (soplex,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_2b8.ld,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_228.ld);
    if (bVar5) {
      bVar5 = ::soplex::
              SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::getDualViolation(soplex,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)&local_338.ld,
                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_228.ld);
      if (!bVar5) goto LAB_004c43ce;
      VVar10 = (soplex->spxout).m_verbosity;
      if ((int)VVar10 < 3) goto LAB_004c4929;
      (soplex->spxout).m_verbosity = INFO1;
      bVar5 = false;
      if ((local_240[0] != cpp_dec_float_NaN) && (bVar5 = false, local_2c0[0] != cpp_dec_float_NaN))
      {
        iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          ((cpp_dec_float<200U,_int,_void> *)&local_2b8.ld,
                           (cpp_dec_float<200U,_int,_void> *)&local_338.ld);
        bVar5 = 0 < iVar6;
      }
      pdVar12 = &local_338;
      if (bVar5) {
        pdVar12 = &local_2b8;
      }
      pdVar11 = pdVar12;
      pdVar14 = &local_128;
      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pdVar14->ld).capacity =
             (((cpp_dec_float<200U,_int,_void> *)&(pdVar11->ld).capacity)->data)._M_elems[0];
        pdVar11 = (data_type *)((long)pdVar11 + ((ulong)bVar16 * -2 + 1) * 4);
        pdVar14 = (data_type *)((long)pdVar14 + ((ulong)bVar16 * -2 + 1) * 4);
      }
      local_b8 = pdVar12[7].ld.capacity;
      local_b4 = *(bool *)((long)pdVar12 + 0x74);
      pfVar8 = local_2c0;
      if (bVar5) {
        pfVar8 = local_240;
      }
      local_b0 = *pfVar8;
      pfVar4 = local_2c0;
      if (bVar5) {
        pfVar4 = local_240;
      }
      fStack_ac = pfVar4[1];
      pcVar13 = "infeasible";
      if ((*pfVar8 != cpp_dec_float_NaN) &&
         (dVar1 = soplex->_currentSettings->_realParamValues[1], !NAN(dVar1))) {
        local_130 = 0x1c00000000;
        local_1a8.la[0] = 0;
        local_1a8.ld.data = (limb_pointer)0x0;
        local_198 = 0;
        uStack_190 = 0;
        local_188 = 0;
        pvStack_180 = (void *)0x0;
        local_178 = 0;
        uStack_170 = 0;
        local_168 = 0;
        uStack_160 = 0;
        local_158 = 0;
        uStack_150 = 0;
        local_148 = 0;
        uStack_140 = 0;
        uStack_13b = 0;
        uStack_138 = 0;
        uStack_134 = 0;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_1a8.ld,dVar1);
        iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          ((cpp_dec_float<200U,_int,_void> *)&local_128.ld,
                           (cpp_dec_float<200U,_int,_void> *)&local_1a8.ld);
        pcVar13 = "infeasible";
        if (iVar6 < 1) {
          pcVar13 = "feasible";
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"Dual solution ",0xe);
      poVar15 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
      sVar7 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,pcVar13,sVar7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                 " in original problem (max. violation = ",0x27);
      VVar2 = (soplex->spxout).m_verbosity;
      ppoVar3 = (soplex->spxout).m_streams;
      poVar15 = ppoVar3[VVar2];
      *(uint *)(poVar15 + *(long *)(*(long *)poVar15 + -0x18) + 0x18) =
           *(uint *)(poVar15 + *(long *)(*(long *)poVar15 + -0x18) + 0x18) & 0xfffffefb | 0x100;
      pdVar12 = &local_128;
      pdVar11 = &local_1a8;
      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
        (((cpp_dec_float<200U,_int,_void> *)&(pdVar11->ld).capacity)->data)._M_elems[0] =
             (pdVar12->ld).capacity;
        pdVar12 = (data_type *)((long)pdVar12 + ((ulong)bVar16 * -2 + 1) * 4);
        pdVar11 = (data_type *)((long)pdVar11 + ((ulong)bVar16 * -2 + 1) * 4);
      }
      uStack_138 = local_b8;
      uStack_134 = local_b4;
      local_130 = CONCAT44(fStack_ac,local_b0);
      boost::multiprecision::operator<<
                (ppoVar3[VVar2],
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_1a8.ld);
      poVar15 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
      lVar9 = *(long *)poVar15;
      *(undefined8 *)(poVar15 + *(long *)(lVar9 + -0x18) + 8) = 8;
      lVar9 = *(long *)(lVar9 + -0x18);
      *(uint *)(poVar15 + lVar9 + 0x18) = *(uint *)(poVar15 + lVar9 + 0x18) & 0xfffffefb | 4;
      pcVar13 = ").\n";
      lVar9 = 3;
    }
    else {
LAB_004c43ce:
      VVar10 = (soplex->spxout).m_verbosity;
      if ((int)VVar10 < 3) goto LAB_004c4929;
      (soplex->spxout).m_verbosity = INFO1;
      poVar15 = (soplex->spxout).m_streams[3];
      pcVar13 = "Could not check dual solution.\n";
      lVar9 = 0x1f;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,pcVar13,lVar9);
  (soplex->spxout).m_verbosity = VVar10;
LAB_004c4929:
  VVar10 = (soplex->spxout).m_verbosity;
  if (2 < (int)VVar10) {
    (soplex->spxout).m_verbosity = INFO1;
    std::__ostream_insert<char,std::char_traits<char>>((soplex->spxout).m_streams[3],"\n",1);
    (soplex->spxout).m_verbosity = VVar10;
  }
  return;
}

Assistant:

void checkSolution(SoPlexBase<R>& soplex)
{
   if(soplex.intParam(SoPlexBase<R>::CHECKMODE) == SoPlexBase<R>::CHECKMODE_RATIONAL
         || (soplex.intParam(SoPlexBase<R>::CHECKMODE) == SoPlexBase<R>::CHECKMODE_AUTO
             && soplex.intParam(SoPlexBase<R>::READMODE) == SoPlexBase<R>::READMODE_RATIONAL))
   {
      checkSolutionRational(soplex);
   }
   else
   {
      checkSolutionReal(soplex);
   }

   SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\n");
}